

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

DictionaryFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_dictionarytype(FeatureType *this)

{
  DictionaryFeatureType *pDVar1;
  DictionaryFeatureType *_msg;
  FeatureType *this_local;
  
  pDVar1 = _internal_mutable_dictionarytype(this);
  return pDVar1;
}

Assistant:

inline ::CoreML::Specification::DictionaryFeatureType* FeatureType::mutable_dictionarytype() {
  ::CoreML::Specification::DictionaryFeatureType* _msg = _internal_mutable_dictionarytype();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.dictionaryType)
  return _msg;
}